

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void search_module_in_paths(char *plugin,GModule **module,char **search_dir)

{
  undefined8 uVar1;
  GModule *pGVar2;
  bool bVar3;
  char *path;
  int search_dir_index;
  char **search_dir_local;
  GModule **module_local;
  char *plugin_local;
  
  path._4_4_ = 0;
  while( true ) {
    bVar3 = false;
    if (*module == (GModule *)0x0) {
      bVar3 = search_dir[path._4_4_] != (char *)0x0;
    }
    if (!bVar3) break;
    uVar1 = g_module_build_path(search_dir[path._4_4_],plugin);
    pGVar2 = (GModule *)g_module_open(uVar1,3);
    *module = pGVar2;
    g_free(uVar1);
    path._4_4_ = path._4_4_ + 1;
  }
  return;
}

Assistant:

static void
search_module_in_paths(char const *plugin, GModule **module,
    char const *const *search_dir)
{
	int search_dir_index = 0;
	while (!*module && search_dir[search_dir_index]) {
		char *path = g_module_build_path(search_dir[search_dir_index],
		    plugin);
		*module = g_module_open(path,
		    G_MODULE_BIND_LAZY | G_MODULE_BIND_LOCAL);
		g_free(path);
		++search_dir_index;
	}
}